

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O3

void test_same_two(void)

{
  void *pvVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  pvVar1 = (*hm_new)();
  (*hm_insert)(pvVar1,0x7a,(void *)0x6f,0);
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c8,0);
  (*hm_insert)(pvVar1,0x7b,(void *)0x1c9,0);
  pvVar2 = (*hm_get)(pvVar1,0x7a);
  if (pvVar2 == (void *)0x6f) {
    pvVar2 = (*hm_get)(pvVar1,0x7b);
    if (pvVar2 == (void *)0x1c8) {
      pvVar2 = (*hm_get)(pvVar1,0x7c);
      if (pvVar2 == (void *)0x0) {
        (*hm_delete)(pvVar1);
        return;
      }
      pvVar1 = (*hm_get)(pvVar1,0x7c);
      pcVar4 = "hm_get(c, 124)";
      pcVar3 = "0";
      uVar5 = 0;
      uVar6 = 0x8e;
    }
    else {
      pvVar1 = (*hm_get)(pvVar1,0x7b);
      pcVar4 = "hm_get(c, 123)";
      pcVar3 = "(void*)456";
      uVar5 = 0x1c8;
      uVar6 = 0x8d;
    }
  }
  else {
    pvVar1 = (*hm_get)(pvVar1,0x7a);
    pcVar4 = "hm_get(c, 122)";
    pcVar3 = "(void*)111";
    uVar5 = 0x6f;
    uVar6 = 0x8c;
  }
  printf(anon_var_dwarf_29b,pcVar4,pvVar1,pcVar3,uVar5,uVar6);
  bad = 1;
  exit(1);
}

Assistant:

static void test_same_two()
{
    void *c = hm_new();
    hm_insert(c, 122, (void*)111, 0);
    hm_insert(c, 123, (void*)456, 0);
    hm_insert(c, 123, (void*)457, 0);
    CHECK(hm_get(c, 122), (void*)111);
    CHECK(hm_get(c, 123), (void*)456);
    CHECK(hm_get(c, 124), 0);
    hm_delete(c);
}